

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_search.c
# Opt level: O1

ps_seg_t * kws_seg_next(ps_seg_t *seg)

{
  int iVar1;
  _func_void_ps_seg_t_ptr *p_Var2;
  int iVar3;
  kws_seg_t *itor;
  
  iVar1 = *(int *)&seg[1].text;
  iVar3 = iVar1 + 1;
  *(int *)&seg[1].text = iVar3;
  if (iVar3 == *(int *)((long)&seg[1].search + 4)) {
    ckd_free(seg[1].vt);
    ckd_free(seg);
    seg = (ps_seg_t *)0x0;
  }
  else {
    p_Var2 = (&(seg[1].vt)->seg_free)[iVar1];
    seg->text = *(char **)p_Var2;
    seg->wid = -1;
    seg->sf = *(frame_idx_t *)(p_Var2 + 8);
    seg->ef = *(frame_idx_t *)(p_Var2 + 0xc);
    seg->prob = *(int32 *)(p_Var2 + 0x10);
    seg->ascr = *(int32 *)(p_Var2 + 0x14);
    seg->lscr = 0;
  }
  return seg;
}

Assistant:

static ps_seg_t *
kws_seg_next(ps_seg_t *seg)
{
    kws_seg_t *itor = (kws_seg_t *)seg;

    if (++itor->pos == itor->n_detections) {
        kws_seg_free(seg);
        return NULL;
    }

    kws_seg_fill(itor);

    return seg;
}